

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * Lowerer::GetLdSpreadIndicesInstr(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *this;
  SymOpnd *pSVar3;
  StackSym *this_00;
  undefined4 *puVar4;
  StackSym *argLinkSym;
  SymOpnd *argLinkOpnd;
  Opnd *src2;
  Instr *instr_local;
  
  this = IR::Instr::GetSrc2(instr);
  bVar2 = IR::Opnd::IsSymOpnd(this);
  if (bVar2) {
    pSVar3 = IR::Opnd::AsSymOpnd(this);
    this_00 = Sym::AsStackSym(pSVar3->m_sym);
    bVar2 = StackSym::IsSingleDef(this_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x6cb0,"(argLinkSym->IsSingleDef())","argLinkSym->IsSingleDef()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    instr_local = (this_00->field_5).m_instrDef;
  }
  else {
    instr_local = (Instr *)0x0;
  }
  return instr_local;
}

Assistant:

IR::Instr* Lowerer::GetLdSpreadIndicesInstr(IR::Instr *instr)
{
    IR::Opnd *src2 = instr->GetSrc2();
    if (!src2->IsSymOpnd())
    {
        return nullptr;
    }

    IR::SymOpnd *   argLinkOpnd = src2->AsSymOpnd();
    StackSym *      argLinkSym  = argLinkOpnd->m_sym->AsStackSym();

    Assert(argLinkSym->IsSingleDef());

    return argLinkSym->m_instrDef;
}